

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::ApproxQuantileState,int,duckdb::ApproxQuantileScalarOperation>
               (int *idata,AggregateInputData *aggr_input_data,ApproxQuantileState **states,
               SelectionVector *isel,SelectionVector *ssel,ValidityMask *mask,idx_t count)

{
  bool bVar1;
  ulong uVar2;
  idx_t i;
  idx_t iVar3;
  idx_t i_1;
  ulong uVar4;
  idx_t iVar5;
  AggregateUnaryInput local_48;
  
  local_48.input = aggr_input_data;
  local_48.input_mask = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      local_48.input_idx = uVar4;
      if (isel->sel_vector != (sel_t *)0x0) {
        local_48.input_idx = (idx_t)isel->sel_vector[uVar4];
      }
      uVar2 = uVar4;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)ssel->sel_vector[uVar4];
      }
      ApproxQuantileOperation::
      Operation<int,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                (states[uVar2],idata + local_48.input_idx,&local_48);
    }
  }
  else {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      local_48.input_idx = iVar3;
      if (isel->sel_vector != (sel_t *)0x0) {
        local_48.input_idx = (idx_t)isel->sel_vector[iVar3];
      }
      iVar5 = iVar3;
      if (ssel->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)ssel->sel_vector[iVar3];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,local_48.input_idx);
      if (bVar1) {
        ApproxQuantileOperation::
        Operation<int,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                  (states[iVar5],idata + local_48.input_idx,&local_48);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}